

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_token
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  pointer paVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *this_00;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  paVar1 = std::
           unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
           operator->(parent);
  this_00 = ast_node::add_child(paVar1,TOKEN);
  paVar1 = std::
           unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
           operator->(this_00);
  ast_node::set_token(paVar1,this->cur_token);
  next(this);
  return true;
}

Assistant:

bool ast::parse_token(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(TOKEN);

    node->set_token(cur_token);
    next();

    return true;
}